

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PythonDataType.h
# Opt level: O0

object __thiscall
anurbs::PythonDataType<anurbs::Model,_anurbs::BrepTrim>::get
          (PythonDataType<anurbs::Model,_anurbs::BrepTrim> *this,Model *model,size_t index)

{
  handle local_40;
  size_t index_local;
  Model *model_local;
  PythonDataType<anurbs::Model,_anurbs::BrepTrim> *this_local;
  
  index_local = index;
  model_local = model;
  this_local = this;
  Model::get<anurbs::BrepTrim>((Model *)&stack0xffffffffffffffc8,index);
  local_40.m_ptr = (PyObject *)0x0;
  pybind11::handle::handle(&local_40);
  pybind11::cast<anurbs::Ref<anurbs::BrepTrim>,_0>
            ((pybind11 *)this,(Ref<anurbs::BrepTrim> *)&stack0xffffffffffffffc8,automatic_reference,
             local_40);
  Ref<anurbs::BrepTrim>::~Ref((Ref<anurbs::BrepTrim> *)&stack0xffffffffffffffc8);
  return (object)(handle)this;
}

Assistant:

pybind11::object get(const TModel& model, const size_t index)
        override
    {
        return pybind11::cast(model.template get<TData>(index));
    }